

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

int * PAL_errno(int caller)

{
  int *piVar1;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  piVar1 = __errno_location();
  return piVar1;
}

Assistant:

int * __cdecl PAL_errno( int caller )
{
    int *retval;
    PERF_ENTRY(errno);
    ENTRY( "PAL_errno( void )\n" );
    retval = (INT*)(&errno);
    LOGEXIT("PAL_errno returns %p\n",retval);
    PERF_EXIT(errno);
    return retval;
}